

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O3

SVGRadialGradientAttributes * __thiscall
lunasvg::SVGRadialGradientElement::collectGradientAttributes
          (SVGRadialGradientAttributes *__return_storage_ptr__,SVGRadialGradientElement *this)

{
  _Rb_tree_header *p_Var1;
  ElementID EVar2;
  SVGRadialGradientElement *pSVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  SVGRadialGradientElement *pSVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  SVGRadialGradientElement *element;
  SVGGradientElement *current;
  set<const_lunasvg::SVGGradientElement_*,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  processedGradients;
  SVGRadialGradientElement *local_68;
  _Rb_tree<const_lunasvg::SVGGradientElement_*,_const_lunasvg::SVGGradientElement_*,_std::_Identity<const_lunasvg::SVGGradientElement_*>,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  local_60;
  
  __return_storage_ptr__->m_fy = (SVGRadialGradientElement *)0x0;
  __return_storage_ptr__->m_r = (SVGRadialGradientElement *)0x0;
  __return_storage_ptr__->m_fx = (SVGRadialGradientElement *)0x0;
  __return_storage_ptr__->m_cx = (SVGRadialGradientElement *)0x0;
  __return_storage_ptr__->m_cy = (SVGRadialGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_gradientUnits = (SVGGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_gradientContentElement =
       (SVGGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_gradientTransform =
       (SVGGradientElement *)0x0;
  (__return_storage_ptr__->super_SVGGradientAttributes).m_spreadMethod = (SVGGradientElement *)0x0;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  do {
    do {
      do {
        SVGGradientElement::collectGradientAttributes
                  (&local_68->super_SVGGradientElement,
                   &__return_storage_ptr__->super_SVGGradientAttributes);
        pSVar6 = local_68;
        if ((local_68->super_SVGGradientElement).super_SVGPaintElement.super_SVGElement.m_id ==
            RadialGradient) {
          if ((__return_storage_ptr__->m_cx == (SVGRadialGradientElement *)0x0) &&
             (bVar5 = SVGElement::hasAttribute((SVGElement *)local_68,Cx), bVar5)) {
            __return_storage_ptr__->m_cx = pSVar6;
          }
          if ((__return_storage_ptr__->m_cy == (SVGRadialGradientElement *)0x0) &&
             (bVar5 = SVGElement::hasAttribute((SVGElement *)pSVar6,Cy), bVar5)) {
            __return_storage_ptr__->m_cy = pSVar6;
          }
          if ((__return_storage_ptr__->m_r == (SVGRadialGradientElement *)0x0) &&
             (bVar5 = SVGElement::hasAttribute((SVGElement *)pSVar6,R), bVar5)) {
            __return_storage_ptr__->m_r = pSVar6;
          }
          if ((__return_storage_ptr__->m_fx == (SVGRadialGradientElement *)0x0) &&
             (bVar5 = SVGElement::hasAttribute((SVGElement *)pSVar6,Fx), bVar5)) {
            __return_storage_ptr__->m_fx = pSVar6;
          }
          if ((__return_storage_ptr__->m_fy == (SVGRadialGradientElement *)0x0) &&
             (bVar5 = SVGElement::hasAttribute((SVGElement *)pSVar6,Fy), bVar5)) {
            __return_storage_ptr__->m_fy = pSVar6;
          }
        }
        pSVar6 = (SVGRadialGradientElement *)
                 SVGURIReference::getTargetElement
                           (&(local_68->super_SVGGradientElement).super_SVGURIReference,
                            (this->super_SVGGradientElement).super_SVGPaintElement.super_SVGElement.
                            super_SVGNode.m_document);
        if ((pSVar6 == (SVGRadialGradientElement *)0x0) ||
           ((EVar2 = (pSVar6->super_SVGGradientElement).super_SVGPaintElement.super_SVGElement.m_id,
            EVar2 != LinearGradient && (EVar2 != RadialGradient)))) goto LAB_00117e98;
        std::
        _Rb_tree<lunasvg::SVGGradientElement_const*,lunasvg::SVGGradientElement_const*,std::_Identity<lunasvg::SVGGradientElement_const*>,std::less<lunasvg::SVGGradientElement_const*>,std::allocator<lunasvg::SVGGradientElement_const*>>
        ::_M_insert_unique<lunasvg::SVGGradientElement_const*const&>
                  ((_Rb_tree<lunasvg::SVGGradientElement_const*,lunasvg::SVGGradientElement_const*,std::_Identity<lunasvg::SVGGradientElement_const*>,std::less<lunasvg::SVGGradientElement_const*>,std::allocator<lunasvg::SVGGradientElement_const*>>
                    *)&local_60,(SVGGradientElement **)&local_68);
        p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var9 = &p_Var1->_M_header;
        local_68 = pSVar6;
      } while (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0);
      do {
        p_Var8 = p_Var9;
        p_Var7 = p_Var4;
        pSVar3 = *(SVGRadialGradientElement **)(p_Var7 + 1);
        p_Var9 = p_Var7;
        if (pSVar3 < pSVar6) {
          p_Var9 = p_Var8;
        }
        p_Var4 = (&p_Var7->_M_left)[pSVar3 < pSVar6];
      } while ((&p_Var7->_M_left)[pSVar3 < pSVar6] != (_Base_ptr)0x0);
    } while ((_Rb_tree_header *)p_Var9 == p_Var1);
    if (pSVar3 < pSVar6) {
      p_Var7 = p_Var8;
    }
  } while (pSVar6 < *(SVGRadialGradientElement **)(p_Var7 + 1));
LAB_00117e98:
  SVGRadialGradientAttributes::setDefaultValues(__return_storage_ptr__,this);
  std::
  _Rb_tree<const_lunasvg::SVGGradientElement_*,_const_lunasvg::SVGGradientElement_*,_std::_Identity<const_lunasvg::SVGGradientElement_*>,_std::less<const_lunasvg::SVGGradientElement_*>,_std::allocator<const_lunasvg::SVGGradientElement_*>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

SVGRadialGradientAttributes SVGRadialGradientElement::collectGradientAttributes() const
{
    SVGRadialGradientAttributes attributes;
    std::set<const SVGGradientElement*> processedGradients;
    const SVGGradientElement* current = this;
    while(true) {
        current->collectGradientAttributes(attributes);
        if(current->id() == ElementID::RadialGradient) {
            auto element = static_cast<const SVGRadialGradientElement*>(current);
            if(!attributes.hasCx() && element->hasAttribute(PropertyID::Cx))
                attributes.setCx(element);
            if(!attributes.hasCy() && element->hasAttribute(PropertyID::Cy))
                attributes.setCy(element);
            if(!attributes.hasR() && element->hasAttribute(PropertyID::R))
                attributes.setR(element);
            if(!attributes.hasFx() && element->hasAttribute(PropertyID::Fx))
                attributes.setFx(element);
            if(!attributes.hasFy() && element->hasAttribute(PropertyID::Fy)) {
                attributes.setFy(element);
            }
        }

        auto targetElement = current->getTargetElement(document());
        if(!targetElement || !(targetElement->id() == ElementID::LinearGradient || targetElement->id() == ElementID::RadialGradient))
            break;
        processedGradients.insert(current);
        current = static_cast<const SVGGradientElement*>(targetElement);
        if(processedGradients.count(current) > 0) {
            break;
        }
    }

    attributes.setDefaultValues(this);
    return attributes;
}